

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O2

void __thiscall agg::curve3_inc::rewind(curve3_inc *this,FILE *__stream)

{
  int iVar1;
  
  iVar1 = *(int *)this;
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x60);
    *(undefined8 *)(this + 0x38) = *(undefined8 *)(this + 0x68);
    *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x70);
    *(undefined8 *)(this + 0x48) = *(undefined8 *)(this + 0x78);
  }
  *(int *)(this + 4) = iVar1;
  return;
}

Assistant:

void curve3_inc::rewind(unsigned)
    {
        if(m_num_steps == 0)
        {
            m_step = -1;
            return;
        }
        m_step = m_num_steps;
        m_fx   = m_saved_fx;
        m_fy   = m_saved_fy;
        m_dfx  = m_saved_dfx;
        m_dfy  = m_saved_dfy;
    }